

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_hal.cpp
# Opt level: O3

MPP_RET mpp_enc_hal_start(void *hal,HalEncTask *task)

{
  MPP_RET MVar1;
  
  if (hal == (void *)0x0 || task == (HalEncTask *)0x0) {
    _mpp_log_l(2,"mpp_enc_hal","found NULL input ctx %p task %p\n","mpp_enc_hal_start",hal,task);
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    MVar1 = MPP_OK;
    if ((*(long *)((long)hal + 0x10) != 0) &&
       (MVar1 = MPP_OK, *(long *)(*(long *)((long)hal + 0x10) + 0x40) != 0)) {
      mpp_buffer_sync_partial_end_f(task->output,0,0,task->length,"mpp_enc_hal_start");
      MVar1 = (**(code **)(*(long *)((long)hal + 0x10) + 0x40))(*(undefined8 *)((long)hal + 8),task)
      ;
      return MVar1;
    }
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_enc_hal_start(void *hal, HalEncTask *task)
{
    if (NULL == hal || NULL == task) {
        mpp_err_f("found NULL input ctx %p task %p\n", hal, task);
        return MPP_ERR_NULL_PTR;
    }

    MppEncHalImpl *p = (MppEncHalImpl*)hal;
    if (!p->api || !p->api->start)
        return MPP_OK;

    /* Add buffer sync process */
    mpp_buffer_sync_partial_end(task->output, 0, task->length);

    return p->api->start(p->ctx, task);
}